

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code.hpp
# Opt level: O2

int __thiscall
system_error2::status_code<system_error2::detail::erased<long,_true>_>::clone
          (status_code<system_error2::detail::erased<long,_true>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  status_code_domain *psVar1;
  char cVar2;
  int iVar3;
  status_code<system_error2::detail::erased<long,_true>_> x;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [24];
  
  psVar1 = (this->
           super_mixin<system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>,_system_error2::detail::erased<long,_true>_>
           ).super_status_code_storage<system_error2::detail::erased<long,_true>_>.
           super_status_code<void>._domain;
  if (psVar1 == (status_code_domain *)0x0) {
    iVar3 = 0;
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    (**(code **)(*(long *)psVar1 + 8))(local_38,psVar1,__child_stack,___flags);
    cVar2 = (**(code **)(*(long *)psVar1 + 0x38))(psVar1,&local_48,this);
    if (cVar2 == '\0') {
      abort();
    }
    iVar3 = (int)local_48;
  }
  return iVar3;
}

Assistant:

SYSTEM_ERROR2_CONSTEXPR20 status_code clone() const
  {
    if(nullptr == this->_domain)
    {
      return {};
    }
    status_code x;
    if(!this->_domain->_do_erased_copy(x, *this, this->_domain->payload_info()))
    {
      abort();  // should not be possible
    }
    return x;
  }